

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkPartitionedSat
              (Abc_Ntk_t *pNtk,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x76d,"int Abc_NtkPartitionedSat(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                 );
  }
  if (pNtk->nObjCounts[8] == 0) {
    p = Abc_NtkToDar(pNtk,0,0);
    iVar1 = Aig_ManPartitionedSat
                      (p,nAlgo,nPartSize,nConfPart,nConfTotal,fAlignPol,fSynthesize,fVerbose);
    pNtk->pModel = (int *)p->pData;
    p->pData = (void *)0x0;
    Aig_ManStop(p);
    return iVar1;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x76e,"int Abc_NtkPartitionedSat(Abc_Ntk_t *, int, int, int, int, int, int, int)");
}

Assistant:

int Abc_NtkPartitionedSat( Abc_Ntk_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    extern int Aig_ManPartitionedSat( Aig_Man_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose );
    Aig_Man_t * pMan;
    int RetValue;//, clk = Abc_Clock();
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    RetValue = Aig_ManPartitionedSat( pMan, nAlgo, nPartSize, nConfPart, nConfTotal, fAlignPol, fSynthesize, fVerbose ); 
    pNtk->pModel = (int *)pMan->pData, pMan->pData = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}